

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

void * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::element_ptr(consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  void *pvVar2;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x403);
  }
  i_control = (this->m_consume_data).m_control;
  bVar1 = detail::
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::external(&this->m_consume_data);
  pvVar2 = detail::
           LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
           ::get_element(i_control,bVar1);
  return pvVar2;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_element(m_consume_data.m_control, m_consume_data.external());
            }